

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Var * __thiscall
kratos::Generator::var(Generator *this,string *var_name,uint32_t width,uint32_t size,bool is_signed)

{
  Var *pVVar1;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint32_t local_38;
  allocator_type local_31;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__l,&local_31);
  pVVar1 = var(this,var_name,width,&local_50,is_signed);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, uint32_t size, bool is_signed) {
    const auto &lst = std::vector<uint32_t>{size};
    return var(var_name, width, lst, is_signed);
}